

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandPermute(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  uint fInputs;
  char *pcVar5;
  uint local_54;
  uint local_50;
  uint local_4c;
  char *local_48;
  
  pAVar3 = pAbc->pNtkCur;
  local_48 = (char *)0x0;
  Extra_UtilGetoptReset();
  fInputs = 1;
  local_54 = 1;
  bVar1 = false;
  local_50 = local_54;
  local_4c = local_54;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"Fiofnxh"), iVar2 == 0x78) {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    switch(iVar2) {
    case 0x66:
      local_50 = local_50 ^ 1;
      break;
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
switchD_00208b8d_caseD_67:
      pcVar4 = "Unknown switch.\n";
      iVar2 = -2;
      goto LAB_00208be6;
    case 0x68:
      goto switchD_00208b8d_caseD_68;
    case 0x69:
      fInputs = fInputs ^ 1;
      break;
    case 0x6e:
      local_4c = local_4c ^ 1;
      break;
    case 0x6f:
      local_54 = local_54 ^ 1;
      break;
    default:
      if (iVar2 == -1) {
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          pcVar4 = "Empty network.\n";
        }
        else if (bVar1) {
          if (pAVar3->nObjCounts[8] == 0) {
            Abc_NtkPermutePiUsingFanout(pAVar3);
            return 0;
          }
          pcVar4 = "Currently \"permute -x\" works only for combinational networks.\n";
        }
        else {
          if (local_4c == 0) {
            pAVar3 = Abc_NtkDup(pAVar3);
          }
          else {
            if (pAVar3->ntkType != ABC_NTK_STRASH) {
              pcVar4 = "To permute nodes, the network should be structurally hashed.\n";
              goto LAB_00208cf2;
            }
            pAVar3 = Abc_NtkRestrashRandom(pAVar3);
          }
          if (pAVar3 != (Abc_Ntk_t *)0x0) {
            Abc_NtkPermute(pAVar3,fInputs,local_54,local_50,local_48);
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
            return 0;
          }
          pcVar4 = "Command \"permute\" has failed.\n";
        }
LAB_00208cf2:
        iVar2 = -1;
        goto LAB_00208cf5;
      }
      if (iVar2 != 0x46) goto switchD_00208b8d_caseD_67;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-F\" should be followed by a file name.\n";
        iVar2 = -1;
LAB_00208be6:
        Abc_Print(iVar2,pcVar4);
switchD_00208b8d_caseD_68:
        iVar2 = -2;
        Abc_Print(-2,"usage: permute [-iofnxh] [-F filename]\n");
        Abc_Print(-2,"\t                performs random permutation of inputs/outputs/flops\n");
        pcVar5 = "yes";
        pcVar4 = "yes";
        if (fInputs == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-i            : toggle permuting primary inputs [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_54 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-o            : toggle permuting primary outputs [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_50 == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,"\t-f            : toggle permuting flip-flops [default = %s]\n",pcVar4);
        pcVar4 = "yes";
        if (local_4c == 0) {
          pcVar4 = "no";
        }
        Abc_Print(-2,
                  "\t-n            : toggle deriving new topological ordering of nodes [default = %s]\n"
                  ,pcVar4);
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,
                  "\t-x            : toggle permuting inputs based on their fanout count [default = %s]\n"
                  ,pcVar5);
        Abc_Print(-2,"\t-h            : print the command usage\n");
        pcVar4 = "\t-F <filename> : (optional) file with the flop permutation\n";
LAB_00208cf5:
        Abc_Print(iVar2,pcVar4);
        return 1;
      }
      local_48 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandPermute( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Ntk_t * Abc_NtkRestrashRandom( Abc_Ntk_t * pNtk );
    extern void Abc_NtkPermutePiUsingFanout( Abc_Ntk_t * pNtk );
    Abc_Ntk_t * pNtk = pAbc->pNtkCur, * pNtkRes = NULL;
    char * pFlopPermFile = NULL;
    int fInputs = 1;
    int fOutputs = 1;
    int fFlops = 1;
    int fNodes = 1;
    int fFanout = 0;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fiofnxh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a file name.\n" );
                goto usage;
            }
            pFlopPermFile = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'i':
            fInputs ^= 1;
            break;
        case 'o':
            fOutputs ^= 1;
            break;
        case 'f':
            fFlops ^= 1;
            break;
        case 'n':
            fNodes ^= 1;
            break;
        case 'x':
            fFanout ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( fFanout )
    {
        if ( Abc_NtkLatchNum(pNtk) )
        {
            Abc_Print( -1, "Currently \"permute -x\" works only for combinational networks.\n" );
            return 1;
        }
        Abc_NtkPermutePiUsingFanout( pNtk );
        return 0;
    }
    if ( fNodes && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "To permute nodes, the network should be structurally hashed.\n" );
        return 1;
    }
    if ( fNodes )
        pNtkRes = Abc_NtkRestrashRandom( pNtk );
    else
        pNtkRes = Abc_NtkDup( pNtk );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command \"permute\" has failed.\n" );
        return 1;
    }
    Abc_NtkPermute( pNtkRes, fInputs, fOutputs, fFlops, pFlopPermFile );
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: permute [-iofnxh] [-F filename]\n" );
    Abc_Print( -2, "\t                performs random permutation of inputs/outputs/flops\n" );
    Abc_Print( -2, "\t-i            : toggle permuting primary inputs [default = %s]\n", fInputs? "yes": "no" );
    Abc_Print( -2, "\t-o            : toggle permuting primary outputs [default = %s]\n", fOutputs? "yes": "no" );
    Abc_Print( -2, "\t-f            : toggle permuting flip-flops [default = %s]\n", fFlops? "yes": "no" );
    Abc_Print( -2, "\t-n            : toggle deriving new topological ordering of nodes [default = %s]\n", fNodes? "yes": "no" );
    Abc_Print( -2, "\t-x            : toggle permuting inputs based on their fanout count [default = %s]\n", fFanout? "yes": "no" );
    Abc_Print( -2, "\t-h            : print the command usage\n");
    Abc_Print( -2, "\t-F <filename> : (optional) file with the flop permutation\n" );
    return 1;
}